

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp_id_tc26_gost_3410_2012_512_paramSetB.c
# Opt level: O3

int point_mul_two_id_tc26_gost_3410_2012_512_paramSetB
              (EC_GROUP *group,EC_POINT *r,BIGNUM *n,EC_POINT *q,BIGNUM *m,BN_CTX *ctx)

{
  uint64_t *puVar1;
  uint64_t *output;
  uint64_t *out1;
  byte bVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  BIGNUM *pBVar7;
  BIGNUM *pBVar8;
  uint uVar9;
  byte bVar10;
  long lVar11;
  bool bVar12;
  pt_prj_t_conflict3 Q;
  uchar b_y [64];
  uchar b_x [64];
  uchar b_m [64];
  uchar b_n [64];
  pt_aff_t_conflict3 P;
  int8_t bnaf [513];
  int8_t anaf [513];
  pt_prj_t_conflict3 precomp [16];
  pt_prj_t_conflict3 local_1298;
  uint8_t local_11d8 [64];
  uint8_t local_1198 [64];
  uchar local_1158 [64];
  uchar local_1118 [64];
  pt_aff_t_conflict3 local_10d8;
  byte local_1058 [528];
  byte local_e48 [528];
  pt_prj_t_conflict3 local_c38 [16];
  
  BN_CTX_start((BN_CTX *)ctx);
  pBVar7 = BN_CTX_get((BN_CTX *)ctx);
  pBVar8 = BN_CTX_get((BN_CTX *)ctx);
  iVar5 = 0;
  iVar6 = 0;
  if (((((pBVar8 != (BIGNUM *)0x0) &&
        (iVar4 = EC_POINT_get_affine_coordinates(group,q,pBVar7,pBVar8,ctx), iVar6 = iVar5,
        iVar4 != 0)) && (iVar5 = BN_bn2lebinpad(pBVar7,local_1198,0x40), iVar5 == 0x40)) &&
      ((iVar5 = BN_bn2lebinpad(pBVar8,local_11d8,0x40), iVar5 == 0x40 &&
       (iVar5 = BN_bn2lebinpad(n,local_1118,0x40), iVar5 == 0x40)))) &&
     (iVar5 = BN_bn2lebinpad(m,local_1158,0x40), iVar5 == 0x40)) {
    fiat_id_tc26_gost_3410_2012_512_paramSetB_from_bytes(local_10d8.X,local_1198);
    puVar1 = local_10d8.Y;
    fiat_id_tc26_gost_3410_2012_512_paramSetB_from_bytes(puVar1,local_11d8);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_to_montgomery(local_10d8.X,local_10d8.X);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_to_montgomery(puVar1,puVar1);
    bVar10 = 0;
    memset(local_e48,0,0x201);
    memset(local_1058,0,0x201);
    memset(&local_1298,0,0xc0);
    precomp_wnaf(local_c38,&local_10d8);
    scalar_wnaf((int8_t *)local_e48,local_1118);
    scalar_wnaf((int8_t *)local_1058,local_1158);
    bVar3 = true;
    lVar11 = 0x200;
    do {
      if (!bVar3) {
        point_double(&local_1298,&local_1298);
      }
      bVar2 = local_1058[lVar11];
      if (bVar2 != 0) {
        if (bVar10 != bVar2 >> 7) {
          fiat_id_tc26_gost_3410_2012_512_paramSetB_opp(local_1298.Y,local_1298.Y);
          bVar10 = bVar10 ^ 1;
        }
        uVar9 = (int)((int)(char)bVar2 - 1U) >> 1;
        if ((char)bVar2 < '\0') {
          uVar9 = (uint)~(int)(char)bVar2 >> 1;
        }
        if (bVar3) {
          local_1298.X[0] = local_c38[(int)uVar9].X[0];
          local_1298.X[1] = local_c38[(int)uVar9].X[1];
          local_1298.X[2] = local_c38[(int)uVar9].X[2];
          local_1298.X[3] = local_c38[(int)uVar9].X[3];
          local_1298.X[4] = local_c38[(int)uVar9].X[4];
          local_1298.X[5] = local_c38[(int)uVar9].X[5];
          local_1298.X[6] = local_c38[(int)uVar9].X[6];
          local_1298.X[7] = local_c38[(int)uVar9].X[7];
          local_1298.Y[0] = local_c38[(int)uVar9].Y[0];
          local_1298.Y[1] = local_c38[(int)uVar9].Y[1];
          local_1298.Y[2] = local_c38[(int)uVar9].Y[2];
          local_1298.Y[3] = local_c38[(int)uVar9].Y[3];
          local_1298.Y[4] = local_c38[(int)uVar9].Y[4];
          local_1298.Y[5] = local_c38[(int)uVar9].Y[5];
          local_1298.Y[6] = local_c38[(int)uVar9].Y[6];
          local_1298.Y[7] = local_c38[(int)uVar9].Y[7];
          local_1298.Z[2] = local_c38[(int)uVar9].Z[2];
          local_1298.Z[3] = local_c38[(int)uVar9].Z[3];
          local_1298.Z[4] = local_c38[(int)uVar9].Z[4];
          local_1298.Z[5] = local_c38[(int)uVar9].Z[5];
          local_1298.Z[6] = local_c38[(int)uVar9].Z[6];
          local_1298.Z[7] = local_c38[(int)uVar9].Z[7];
          local_1298.Z[0] =
               CONCAT44(*(undefined4 *)((long)local_c38[(int)uVar9].Z + 4),
                        (int)local_c38[(int)uVar9].Z[0]);
          local_1298.Z[1] =
               CONCAT44(*(undefined4 *)((long)local_c38[(int)uVar9].Z + 0xc),
                        (int)local_c38[(int)uVar9].Z[1]);
        }
        else {
          point_add_proj(&local_1298,&local_1298,local_c38 + (int)uVar9);
        }
        bVar3 = false;
      }
      bVar2 = local_e48[lVar11];
      if (bVar2 != 0) {
        if (bVar10 != bVar2 >> 7) {
          fiat_id_tc26_gost_3410_2012_512_paramSetB_opp(local_1298.Y,local_1298.Y);
          bVar10 = bVar10 ^ 1;
        }
        uVar9 = (int)((int)(char)bVar2 - 1U) >> 1;
        if ((char)bVar2 < '\0') {
          uVar9 = (uint)~(int)(char)bVar2 >> 1;
        }
        if (bVar3) {
          local_1298.X[0] = lut_cmb[0][(int)uVar9].X[0];
          local_1298.X[1] = lut_cmb[0][(int)uVar9].X[1];
          local_1298.X[2] = lut_cmb[0][(int)uVar9].X[2];
          local_1298.X[3] = lut_cmb[0][(int)uVar9].X[3];
          local_1298.X[4] = lut_cmb[0][(int)uVar9].X[4];
          local_1298.X[5] = lut_cmb[0][(int)uVar9].X[5];
          local_1298.X[6] = lut_cmb[0][(int)uVar9].X[6];
          local_1298.X[7] = lut_cmb[0][(int)uVar9].X[7];
          local_1298.Y[0] = lut_cmb[0][(int)uVar9].Y[0];
          local_1298.Y[1] = lut_cmb[0][(int)uVar9].Y[1];
          local_1298.Y[2] = lut_cmb[0][(int)uVar9].Y[2];
          local_1298.Y[3] = lut_cmb[0][(int)uVar9].Y[3];
          local_1298.Y[4] = lut_cmb[0][(int)uVar9].Y[4];
          local_1298.Y[5] = lut_cmb[0][(int)uVar9].Y[5];
          local_1298.Y[6] = lut_cmb[0][(int)uVar9].Y[6];
          local_1298.Y[7] = lut_cmb[0][(int)uVar9].Y[7];
          local_1298.Z[0] = 0xffffffffffffff91;
          local_1298.Z[1] = 0xffffffffffffffff;
          local_1298.Z[2] = 0xffffffffffffffff;
          local_1298.Z[3] = 0xffffffffffffffff;
          local_1298.Z[4] = 0xffffffffffffffff;
          local_1298.Z[5] = 0xffffffffffffffff;
          local_1298.Z[6] = 0xffffffffffffffff;
          local_1298.Z[7] = 0x7fffffffffffffff;
        }
        else {
          point_add_mixed(&local_1298,&local_1298,lut_cmb[0] + (int)uVar9);
        }
        bVar3 = false;
      }
      bVar12 = lVar11 != 0;
      lVar11 = lVar11 + -1;
    } while (bVar12);
    puVar1 = local_1298.Y;
    if (bVar3) {
      local_1298.X[6] = 0;
      local_1298.X[7] = 0;
      local_1298.X[4] = 0;
      local_1298.X[5] = 0;
      local_1298.X[2] = 0;
      local_1298.X[3] = 0;
      local_1298.X[0] = 0;
      local_1298.X[1] = 0;
      local_1298.Y[6] = 0xffffffffffffffff;
      local_1298.Y[7] = 0x7fffffffffffffff;
      local_1298.Y[4] = 0xffffffffffffffff;
      local_1298.Y[5] = 0xffffffffffffffff;
      local_1298.Y[2] = 0xffffffffffffffff;
      local_1298.Y[3] = 0xffffffffffffffff;
      local_1298.Y[0] = 0xffffffffffffff91;
      local_1298.Y[1] = 0xffffffffffffffff;
      local_1298.Z[0] = 0;
      local_1298.Z[1] = 0;
      local_1298.Z[2] = 0;
      local_1298.Z[3] = 0;
      local_1298.Z[4] = 0;
      local_1298.Z[5] = 0;
      local_1298.Z[6] = 0;
      local_1298.Z[7] = 0;
    }
    if (bVar10 != 0) {
      fiat_id_tc26_gost_3410_2012_512_paramSetB_opp(puVar1,puVar1);
    }
    output = local_1298.Z;
    fiat_id_tc26_gost_3410_2012_512_paramSetB_inv(output,output);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_mul(local_10d8.X,local_1298.X,output);
    out1 = local_10d8.Y;
    fiat_id_tc26_gost_3410_2012_512_paramSetB_mul(out1,puVar1,output);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_from_montgomery(local_10d8.X,local_10d8.X);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_from_montgomery(out1,out1);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_to_bytes(local_1198,local_10d8.X);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_to_bytes(local_11d8,out1);
    iVar6 = CRYPTO_memcmp("",local_1198,0x40);
    if ((iVar6 == 0) && (iVar6 = CRYPTO_memcmp("",local_11d8,0x40), iVar6 == 0)) {
      iVar6 = EC_POINT_set_to_infinity((EC_GROUP *)group,(EC_POINT *)r);
      if (iVar6 == 0) {
        iVar6 = 0;
        goto LAB_00138625;
      }
    }
    else {
      lVar11 = BN_lebin2bn(local_1198,0x40,pBVar7);
      iVar6 = 0;
      if ((lVar11 == 0) ||
         ((lVar11 = BN_lebin2bn(local_11d8,0x40,pBVar8), lVar11 == 0 ||
          (iVar5 = EC_POINT_set_affine_coordinates(group,r,pBVar7,pBVar8,ctx), iVar5 == 0))))
      goto LAB_00138625;
    }
    iVar6 = 1;
  }
LAB_00138625:
  BN_CTX_end((BN_CTX *)ctx);
  return iVar6;
}

Assistant:

int
    point_mul_two_id_tc26_gost_3410_2012_512_paramSetB(
        const EC_GROUP *group, EC_POINT *r, const BIGNUM *n, const EC_POINT *q,
        const BIGNUM *m, BN_CTX *ctx) {
    int ret = 0;
    unsigned char b_x[64];
    unsigned char b_y[64];
    unsigned char b_n[64];
    unsigned char b_m[64];
    BIGNUM *x = NULL, *y = NULL;

    BN_CTX_start(ctx);
    x = BN_CTX_get(ctx);
    if ((y = BN_CTX_get(ctx)) == NULL
        /* pull out coords as bytes */
        || !EC_POINT_get_affine_coordinates(group, q, x, y, ctx) ||
        BN_bn2lebinpad(x, b_x, 64) != 64 || BN_bn2lebinpad(y, b_y, 64) != 64 ||
        BN_bn2lebinpad(n, b_n, 64) != 64 || BN_bn2lebinpad(m, b_m, 64) != 64)
        goto err;
    /* do the simultaneous scalar multiplication */
    point_mul_two(b_x, b_y, b_n, b_m, b_x, b_y);
    /* check for infinity */
    if (CRYPTO_memcmp(const_zb, b_x, 64) == 0 &&
        CRYPTO_memcmp(const_zb, b_y, 64) == 0) {
        if (!EC_POINT_set_to_infinity(group, r)) goto err;
    } else {
        /* otherwise, pack the bytes into the result */
        if (BN_lebin2bn(b_x, 64, x) == NULL ||
            BN_lebin2bn(b_y, 64, y) == NULL ||
            !EC_POINT_set_affine_coordinates(group, r, x, y, ctx))
            goto err;
    }
    ret = 1;
err:
    BN_CTX_end(ctx);
    return ret;
}